

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O0

void __thiscall CEffects::SmokeTrail(CEffects *this,vec2 Pos,vec2 Vel)

{
  long lVar1;
  CParticle *in_RDI;
  long in_FS_OFFSET;
  vec2 this_00;
  CParticle p;
  CParticle *v;
  int Group;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_Spr & 1) != 0) {
    v = in_RDI;
    CParticle::CParticle(in_RDI);
    CParticle::SetDefault(in_RDI);
    this_00 = RandomDir();
    vector2_base<float>::operator*((vector2_base<float> *)this_00,(float)((ulong)v >> 0x20));
    vector2_base<float>::operator+((vector2_base<float> *)this_00,&v->m_Pos);
    Group = (int)((ulong)v >> 0x20);
    random_float();
    random_float();
    random_float();
    CParticles::Add((CParticles *)this_00,Group,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEffects::SmokeTrail(vec2 Pos, vec2 Vel)
{
	if(!m_Add50hz)
		return;

	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_SMOKE;
	p.m_Pos = Pos;
	p.m_Vel = Vel + RandomDir()*50.0f;
	p.m_LifeSpan = 0.5f + random_float()*0.5f;
	p.m_StartSize = 12.0f + random_float()*8;
	p.m_EndSize = 0;
	p.m_Friction = 0.7f;
	p.m_Gravity = random_float()*-500.0f;
	m_pClient->m_pParticles->Add(CParticles::GROUP_PROJECTILE_TRAIL, &p);
}